

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::WriteTargetSpecifics
          (cmGhsMultiTargetGenerator *this,ostream *fout,string *config)

{
  string *psVar1;
  ostream *poVar2;
  string outpath;
  string binpath;
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [48];
  string local_68;
  cmAlphaNum local_48;
  
  local_d8 = local_c8;
  local_d0 = 0;
  local_c8[0] = 0;
  if (this->TagType != SUBPROJECT) {
    psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                       (&this->LocalGenerator->super_cmLocalGenerator);
    local_48.View_._M_str = (psVar1->_M_dataplus)._M_p;
    local_48.View_._M_len = psVar1->_M_string_length;
    local_98._8_8_ = local_98 + 0x10;
    local_98._0_8_ = (pointer)0x1;
    local_98[0x10] = '/';
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
              (&local_b8,this->LocalGenerator,this->GeneratorTarget);
    cmStrCat<std::__cxx11::string>(&local_68,&local_48,(cmAlphaNum *)local_98,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    cmGeneratorTarget::GetDirectory
              ((string *)local_98,this->GeneratorTarget,config,RuntimeBinaryArtifact);
    cmSystemTools::RelativePath((string *)&local_48,&local_68,(string *)local_98);
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)local_98);
    poVar2 = std::operator<<(fout,"    :binDirRelative=\"");
    poVar2 = std::operator<<(poVar2,(string *)&local_d8);
    poVar2 = std::operator<<(poVar2,"\"\n    -o \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->TargetNameReal);
    std::operator<<(poVar2,"\"\n");
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::assign((char *)&local_d8);
  poVar2 = std::operator<<(fout,"    :outputDirRelative=\"");
  poVar2 = std::operator<<(poVar2,(string *)&local_d8);
  std::operator<<(poVar2,"\"\n");
  std::__cxx11::string::~string((string *)&local_d8);
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteTargetSpecifics(std::ostream& fout,
                                                     const std::string& config)
{
  std::string outpath;

  /* Determine paths from the target project file to where the output artifacts
   * need to be located.
   */
  if (this->TagType != GhsMultiGpj::SUBPROJECT) {
    // set target binary file destination
    std::string binpath = cmStrCat(
      this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
      this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget));
    outpath = cmSystemTools::RelativePath(
      binpath, this->GeneratorTarget->GetDirectory(config));
    /* clang-format off */
    fout << "    :binDirRelative=\"" << outpath << "\"\n"
            "    -o \"" << this->TargetNameReal << "\"\n";
    /* clang-format on */
  }

  // set target object file destination
  outpath = ".";
  fout << "    :outputDirRelative=\"" << outpath << "\"\n";
}